

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O2

void __thiscall
OpenMD::Utils::
AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>::
writeErrorBars(AccumulatorView<OpenMD::Utils::Accumulator<std::vector<double,_std::allocator<double>_>_>_>
               *this,ostream *stream,string *errorMessage,ErrorHandling errorHandling)

{
  StdVectorAccumulator *this_00;
  int i;
  ulong uVar1;
  long lVar2;
  bool bVar3;
  vector<double,_std::allocator<double>_> err;
  _Vector_base<double,_std::allocator<double>_> local_78;
  size_t local_58;
  _Vector_base<double,_std::allocator<double>_> local_50;
  string *local_38;
  
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->super_StdVectorAccumulator;
  local_58 = (this->super_StdVectorAccumulator).Count_;
  local_38 = errorMessage;
  if (errorHandling == Variance) {
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getVariance
              ((vector<double,_std::allocator<double>_> *)&local_50,this_00);
  }
  else if (errorHandling == StdDev) {
    Accumulator<std::vector<double,_std::allocator<double>_>_>::getStdDev
              ((vector<double,_std::allocator<double>_> *)&local_50,this_00);
  }
  else {
    if (errorHandling != CI95) goto LAB_0022a0ff;
    Accumulator<std::vector<double,_std::allocator<double>_>_>::get95percentConfidenceInterval
              ((vector<double,_std::allocator<double>_> *)&local_50,this_00);
  }
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)&local_78,&local_50);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
LAB_0022a0ff:
  bVar3 = local_58 == 0;
  uVar1 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_50,
               &(this->super_StdVectorAccumulator).Avg_);
    lVar2 = (long)local_50._M_impl.super__Vector_impl_data._M_finish -
            (long)local_50._M_impl.super__Vector_impl_data._M_start;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
    if ((ulong)(lVar2 >> 3) <= uVar1) {
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
      return;
    }
    if (errorHandling == CI95 && bVar3) {
LAB_0022a148:
      std::operator<<(stream,"\t");
    }
    else if ((ulong)ABS(local_78._M_impl.super__Vector_impl_data._M_start[uVar1]) <
             0x7ff0000000000000) {
      if (local_58 == 0) goto LAB_0022a148;
      std::operator<<(stream,"\t");
      std::ostream::_M_insert<double>(local_78._M_impl.super__Vector_impl_data._M_start[uVar1]);
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(local_38->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      std::vector<RealType> err;
      std::size_t count = StdVectorAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = StdVectorAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = StdVectorAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = StdVectorAccumulator::getVariance();
        break;
      default:
        break;
      }

      for (int i = 0; i < StdVectorAccumulator::getAverage().size(); i++) {
        if (count == 0 && errorHandling == ErrorHandling::CI95) {
          stream << "\t";
        } else {
          if (std::isinf(err[i]) || std::isnan(err[i])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                     errorMessage.c_str());
            painCave.isFatal = 1;
            simError();
          } else {
            if (count == 0)
              stream << "\t";
            else
              stream << "\t" << err[i];
          }
        }
      }
    }